

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3HasExplicitNulls(Parse *pParse,ExprList *pList)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  anon_struct_4_9_b482b7ef_for_fg *paVar5;
  anon_struct_4_9_b482b7ef_for_fg *paVar6;
  bool bVar7;
  
  if (pList != (ExprList *)0x0) {
    uVar2 = (ulong)pList->nExpr;
    bVar7 = 0 < (long)uVar2;
    if (0 < (long)uVar2) {
      if ((pList->a[0].fg.field_0x1 & 0x20) == 0) {
        uVar3 = 0;
        paVar6 = &pList->a[0].fg;
        do {
          if (uVar2 - 1 == uVar3) {
            return 0;
          }
          paVar5 = paVar6 + 6;
          uVar3 = uVar3 + 1;
          lVar1 = (long)(paVar6 + 6);
          paVar6 = paVar5;
        } while ((*(byte *)(lVar1 + 1) & 0x20) == 0);
        bVar7 = uVar3 < uVar2;
      }
      else {
        paVar5 = &pList->a[0].fg;
      }
      pcVar4 = "LAST";
      if (paVar5->sortFlags == '\x03') {
        pcVar4 = "FIRST";
      }
      if (paVar5->sortFlags == '\0') {
        pcVar4 = "FIRST";
      }
      sqlite3ErrorMsg(pParse,"unsupported use of NULLS %s",pcVar4);
      if (bVar7) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3HasExplicitNulls(Parse *pParse, ExprList *pList){
  if( pList ){
    int i;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].fg.bNulls ){
        u8 sf = pList->a[i].fg.sortFlags;
        sqlite3ErrorMsg(pParse, "unsupported use of NULLS %s",
            (sf==0 || sf==3) ? "FIRST" : "LAST"
        );
        return 1;
      }
    }
  }
  return 0;
}